

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfparse.c
# Opt level: O2

int sf_parser_item(sf_parser *sfp,sf_value *dest)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  uint uVar3;
  int iVar4;
  
  uVar1 = sfp->state;
  if (uVar1 == 0x1c) {
    iVar4 = parser_skip_inner_list(sfp);
    if (iVar4 == 0) goto LAB_0011623f;
LAB_0011624b:
    uVar3 = 0xffffffff;
  }
  else {
    if (uVar1 == 0x19) {
LAB_0011623f:
      iVar4 = parser_skip_params(sfp);
      if (iVar4 != 0) goto LAB_0011624b;
    }
    else if (uVar1 != 0x1b) {
      if (uVar1 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/sfparse.c"
                      ,0x3e4,"int sf_parser_item(sf_parser *, sf_value *)");
      }
      parser_discard_sp(sfp);
      puVar2 = sfp->pos;
      if (puVar2 != sfp->end) {
        if (*puVar2 == '(') {
          if (dest != (sf_value *)0x0) {
            dest->type = SF_TYPE_INNER_LIST;
            dest->flags = 0;
          }
          sfp->pos = puVar2 + 1;
          sfp->state = 0x1c;
        }
        else {
          iVar4 = parser_bare_item(sfp,dest);
          if (iVar4 != 0) {
            return iVar4;
          }
          sfp->state = 0x19;
        }
        return 0;
      }
      goto LAB_0011624b;
    }
    parser_discard_sp(sfp);
    uVar3 = ~(uint)(sfp->pos == sfp->end);
  }
  return uVar3;
}

Assistant:

int sf_parser_item(sf_parser *sfp, sf_value *dest) {
  int rv;

  switch (sfp->state) {
  case SF_STATE_INITIAL:
    parser_discard_sp(sfp);

    if (parser_eof(sfp)) {
      return SF_ERR_PARSE_ERROR;
    }

    break;
  case SF_STATE_ITEM_INNER_LIST_BEFORE:
    rv = parser_skip_inner_list(sfp);
    if (rv != 0) {
      return rv;
    }

    /* fall through */
  case SF_STATE_ITEM_BEFORE_PARAMS:
    rv = parser_skip_params(sfp);
    if (rv != 0) {
      return rv;
    }

    /* fall through */
  case SF_STATE_ITEM_AFTER:
    parser_discard_sp(sfp);

    if (!parser_eof(sfp)) {
      return SF_ERR_PARSE_ERROR;
    }

    return SF_ERR_EOF;
  default:
    assert(0);
    abort();
  }

  if (*sfp->pos == '(') {
    if (dest) {
      dest->type = SF_TYPE_INNER_LIST;
      dest->flags = SF_VALUE_FLAG_NONE;
    }

    ++sfp->pos;

    sfp->state = SF_STATE_ITEM_INNER_LIST_BEFORE;

    return 0;
  }

  rv = parser_bare_item(sfp, dest);
  if (rv != 0) {
    return rv;
  }

  sfp->state = SF_STATE_ITEM_BEFORE_PARAMS;

  return 0;
}